

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  undefined8 uVar1;
  bool bVar2;
  type_conflict tVar3;
  bool bVar4;
  Classifier CVar5;
  int iVar6;
  int iVar7;
  reference pvVar8;
  HorribleError *pHVar9;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar10;
  App *pAVar11;
  long lVar12;
  undefined1 *puVar13;
  char *pcVar14;
  pointer pOVar15;
  results_t *prVar16;
  int *piVar17;
  ArgumentMismatch *pAVar18;
  size_type sVar19;
  ulong uVar20;
  byte local_841;
  int local_804;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  undefined1 local_6c9;
  string local_6c8;
  string local_6a8;
  string local_688;
  pointer local_668;
  string local_660;
  string local_640;
  undefined1 local_620 [8];
  string res_1;
  string local_5f8;
  string local_5d8;
  undefined1 local_5b8 [8];
  string arg;
  size_t remreqpos;
  string local_588;
  string local_568;
  pointer local_548;
  string local_540;
  string local_520 [8];
  string current_;
  string local_4f8;
  pointer local_4d8;
  string local_4d0;
  pointer local_4b0;
  string local_4a8;
  string local_488;
  undefined1 local_468 [8];
  string res;
  int local_440;
  int result_count;
  int collected;
  int tmax;
  int max_num;
  int local_42c;
  undefined1 local_428 [4];
  int min_num;
  reference local_408;
  Option_p *op;
  undefined1 local_3f8 [7];
  bool val;
  string dummy2;
  string dummy1;
  undefined1 local_398 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> nval;
  allocator local_351;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string local_310 [32];
  undefined1 local_2f0 [8];
  string v;
  App *local_2b0;
  App *sub;
  size_type dotloc;
  anon_class_32_1_6b09f7e2_for__M_pred local_298;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_278;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_270;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_268;
  allocator<char> local_25a;
  undefined1 local_259;
  undefined1 *local_258;
  undefined8 local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined1 local_208 [8];
  string nvalue;
  string narg_name;
  shared_ptr<CLI::App> *subc;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2;
  anon_class_40_2_a297e68f_for__M_pred local_198;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_170;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_168;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_160;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string local_150;
  undefined1 local_12a;
  allocator local_129;
  string local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100;
  undefined1 local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_a8 [8];
  string rest;
  string value;
  string arg_name;
  string current;
  bool local_processing_only_local;
  Classifier current_type_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  pvVar8 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::back(args);
  ::std::__cxx11::string::string((string *)(arg_name.field_2._M_local_buf + 8),(string *)pvVar8);
  ::std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)local_a8);
  switch(current_type) {
  case NONE:
  case POSITIONAL_MARK:
  case SUBCOMMAND:
  case SUBCOMMAND_TERMINATOR:
  default:
    op_ptr._M_current._6_1_ = 1;
    pHVar9 = (HorribleError *)__cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_150,
               "parsing got called with invalid option! You should not see this",
               (allocator *)((long)&op_ptr._M_current + 7));
    HorribleError::HorribleError(pHVar9,&local_150);
    op_ptr._M_current._6_1_ = 0;
    __cxa_throw(pHVar9,&HorribleError::typeinfo,HorribleError::~HorribleError);
  case SHORT:
    bVar2 = detail::split_short((string *)((long)&arg_name.field_2 + 8),
                                (string *)((long)&value.field_2 + 8),(string *)local_a8);
    if (!bVar2) {
      local_102 = 1;
      pHVar9 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_100,"Short parsed but missing! You should not see this",&local_101
                );
      HorribleError::HorribleError(pHVar9,&local_100);
      local_102 = 0;
      __cxa_throw(pHVar9,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case LONG:
    bVar2 = detail::split_long((string *)((long)&arg_name.field_2 + 8),
                               (string *)((long)&value.field_2 + 8),
                               (string *)((long)&rest.field_2 + 8));
    if (!bVar2) {
      local_d9 = 1;
      pHVar9 = (HorribleError *)__cxa_allocate_exception(0x38);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::operator+(&local_d8,"Long parsed but missing (you should not see this):",pvVar8);
      HorribleError::HorribleError(pHVar9,&local_d8);
      local_d9 = 0;
      __cxa_throw(pHVar9,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
    break;
  case WINDOWS_STYLE:
    bVar2 = detail::split_windows_style
                      ((string *)((long)&arg_name.field_2 + 8),(string *)((long)&value.field_2 + 8),
                       (string *)((long)&rest.field_2 + 8));
    if (!bVar2) {
      local_12a = 1;
      pHVar9 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_128,"windows option parsed but missing! You should not see this",
                 &local_129);
      HorribleError::HorribleError(pHVar9,&local_128);
      local_12a = 0;
      __cxa_throw(pHVar9,&HorribleError::typeinfo,HorribleError::~HorribleError);
    }
  }
  local_168._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  local_170._M_current =
       (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
       ::std::
       end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                 (&this->options_);
  ::std::__cxx11::string::string((string *)&local_198,(string *)(value.field_2._M_local_buf + 8));
  local_198.current_type = current_type;
  local_160 = ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (local_168,local_170,&local_198);
  _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
  ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
            ((_lambda_std__unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const___1_ *)
             &local_198);
  __range2 = (vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       (&this->options_);
  bVar2 = __gnu_cxx::operator==
                    (&local_160,
                     (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                      *)&__range2);
  if (bVar2) {
    __end2 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
    subc = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&this->subcommands_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                       *)&subc), bVar2) {
      this_00 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                ::operator*(&__end2);
      std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this_00);
      uVar20 = ::std::__cxx11::string::empty();
      if (((uVar20 & 1) != 0) &&
         (peVar10 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(this_00), (peVar10->disabled_ & 1U) == 0)) {
        peVar10 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->(this_00);
        bVar2 = _parse_arg(peVar10,args,current_type,param_3);
        if (bVar2) {
          peVar10 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->(this_00);
          if ((peVar10->pre_parse_called_ & 1U) == 0) {
            peVar10 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->(this_00);
            sVar19 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(args);
            _trigger_pre_parse(peVar10,sVar19);
          }
          this_local._7_1_ = 1;
          goto LAB_00189e1c;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
      ::operator++(&__end2);
    }
    if ((((this->allow_non_standard_options_ & 1U) != 0) && (current_type == SHORT)) &&
       (uVar20 = ::std::__cxx11::string::size(), 2 < uVar20)) {
      ::std::__cxx11::string::string((string *)(nvalue.field_2._M_local_buf + 8));
      ::std::__cxx11::string::string((string *)local_208);
      local_259 = 0x2d;
      local_258 = &local_259;
      local_250 = 1;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_248,local_258,local_250);
      ::std::operator+(&local_228,&local_248,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&arg_name.field_2 + 8));
      detail::split_long(&local_228,(string *)((long)&nvalue.field_2 + 8),(string *)local_208);
      ::std::__cxx11::string::~string((string *)&local_228);
      ::std::__cxx11::string::~string((string *)&local_248);
      ::std::allocator<char>::~allocator(&local_25a);
      local_270._M_current =
           (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
           ::std::
           begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                     (&this->options_);
      local_278._M_current =
           (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
           ::std::
           end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                     (&this->options_);
      ::std::__cxx11::string::string
                ((string *)&local_298,(string *)(nvalue.field_2._M_local_buf + 8));
      local_268 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (local_270,local_278,&local_298);
      local_160 = (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                   )local_268;
      _parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)
      ::{lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#2}::~unique_ptr
                ((_lambda_std__unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const___2_ *)
                 &local_298);
      dotloc = (size_type)
               ::std::
               end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                         (&this->options_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_160,
                         (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                          *)&dotloc);
      if (bVar2) {
        ::std::__cxx11::string::operator=
                  ((string *)(value.field_2._M_local_buf + 8),
                   (string *)(nvalue.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=
                  ((string *)(rest.field_2._M_local_buf + 8),(string *)local_208);
        ::std::__cxx11::string::clear();
      }
      ::std::__cxx11::string::~string((string *)local_208);
      ::std::__cxx11::string::~string((string *)(nvalue.field_2._M_local_buf + 8));
      if (bVar2) goto LAB_00188e55;
    }
    if ((this->parent_ != (App *)0x0) &&
       (uVar20 = ::std::__cxx11::string::empty(), (uVar20 & 1) != 0)) {
      this_local._7_1_ = 0;
      goto LAB_00189e1c;
    }
    pAVar11 = (App *)::std::__cxx11::string::find_first_of((char)&value + '\x18',0x2e);
    sub = pAVar11;
    current.field_2._M_local_buf[0xf] = current_type;
    if ((pAVar11 != (App *)0xffffffffffffffff) &&
       (lVar12 = ::std::__cxx11::string::size(), pAVar11 < (App *)(lVar12 - 1U))) {
      ::std::__cxx11::string::substr
                ((ulong)((long)&v.field_2 + 8),(ulong)((long)&value.field_2 + 8));
      pAVar11 = _find_subcommand(this,(string *)((long)&v.field_2 + 8),true,false);
      ::std::__cxx11::string::~string((string *)(v.field_2._M_local_buf + 8));
      local_2b0 = pAVar11;
      if (pAVar11 != (App *)0x0) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(args);
        ::std::__cxx11::string::string((string *)local_2f0,(string *)pvVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(args);
        ::std::__cxx11::string::substr((ulong)local_310,(ulong)((long)&value.field_2 + 8));
        ::std::__cxx11::string::operator=((string *)(value.field_2._M_local_buf + 8),local_310);
        ::std::__cxx11::string::~string(local_310);
        uVar20 = ::std::__cxx11::string::size();
        if (uVar20 < 2) {
          ::std::__cxx11::string::substr((ulong)local_398,(ulong)local_2f0);
          puVar13 = (undefined1 *)::std::__cxx11::string::front();
          *puVar13 = 0x2d;
          uVar20 = ::std::__cxx11::string::size();
          if (2 < uVar20) {
            ::std::__cxx11::string::substr((ulong)((long)&dummy1.field_2 + 8),(ulong)local_398);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)((long)&dummy1.field_2 + 8));
            ::std::__cxx11::string::~string((string *)(dummy1.field_2._M_local_buf + 8));
            ::std::__cxx11::string::resize((ulong)local_398);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,(value_type *)local_398);
          current.field_2._M_local_buf[0xf] = '\x02';
          ::std::__cxx11::string::~string((string *)local_398);
        }
        else {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_350,"--",&local_351);
          ::std::__cxx11::string::substr((ulong)((long)&nval.field_2 + 8),(ulong)local_2f0);
          ::std::operator+(&local_330,&local_350,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&nval.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,&local_330);
          ::std::__cxx11::string::~string((string *)&local_330);
          ::std::__cxx11::string::~string((string *)(nval.field_2._M_local_buf + 8));
          ::std::__cxx11::string::~string((string *)&local_350);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_351);
          current.field_2._M_local_buf[0xf] = '\x03';
        }
        ::std::__cxx11::string::string((string *)(dummy2.field_2._M_local_buf + 8));
        ::std::__cxx11::string::string((string *)local_3f8);
        op._7_1_ = 0;
        if (current.field_2._M_local_buf[0xf] == '\x02') {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(args);
          pcVar14 = (char *)::std::__cxx11::string::operator[]((ulong)pvVar8);
          bVar2 = detail::valid_first_char<char>(*pcVar14);
          if (!bVar2) goto LAB_00188bbf;
LAB_00188bf2:
          op._7_1_ = _parse_arg(local_2b0,args,current.field_2._M_local_buf[0xf],true);
        }
        else {
LAB_00188bbf:
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(args);
          bVar2 = detail::split_long(pvVar8,(string *)((long)&dummy2.field_2 + 8),
                                     (string *)local_3f8);
          if (bVar2) goto LAB_00188bf2;
        }
        if ((op._7_1_ & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(args);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(args,(value_type *)local_2f0);
          bVar2 = false;
        }
        else {
          if ((local_2b0->silent_ & 1U) == 0) {
            std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::push_back
                      (&this->parsed_subcommands_,&local_2b0);
          }
          increment_parsed(this);
          sVar19 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(args);
          _trigger_pre_parse(this,sVar19);
          bVar2 = ::std::function::operator_cast_to_bool
                            ((function *)&local_2b0->parse_complete_callback_);
          if (bVar2) {
            _process_env(local_2b0);
            _process_callbacks(local_2b0);
            _process_help_flags(local_2b0,false,false);
            _process_requirements(local_2b0);
            run_callback(local_2b0,false,true);
          }
          this_local._7_1_ = 1;
          bVar2 = true;
        }
        ::std::__cxx11::string::~string((string *)local_3f8);
        ::std::__cxx11::string::~string((string *)(dummy2.field_2._M_local_buf + 8));
        ::std::__cxx11::string::~string((string *)local_2f0);
        if (bVar2) goto LAB_00189e1c;
      }
    }
    if (param_3) {
      this_local._7_1_ = 0;
    }
    else if ((this->parent_ == (App *)0x0) || ((this->fallthrough_ & 1U) == 0)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      _move_to_missing(this,current.field_2._M_local_buf[0xf],
                       (string *)((long)&arg_name.field_2 + 8));
      this_local._7_1_ = 1;
    }
    else {
      pAVar11 = _get_fallthrough_parent(this);
      this_local._7_1_ = _parse_arg(pAVar11,args,current.field_2._M_local_buf[0xf],false);
    }
    goto LAB_00189e1c;
  }
LAB_00188e55:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(args);
  local_408 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
              ::operator*(&local_160);
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  bVar2 = Option::get_inject_separator(pOVar15);
  if (bVar2) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    prVar16 = Option::results_abi_cxx11_(pOVar15);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(prVar16);
    if (!bVar2) {
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      prVar16 = Option::results_abi_cxx11_(pOVar15);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back(prVar16);
      uVar20 = ::std::__cxx11::string::empty();
      if ((uVar20 & 1) == 0) {
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        ::std::__cxx11::string::string((string *)local_428);
        Option::add_result(pOVar15,(string *)local_428);
        ::std::__cxx11::string::~string((string *)local_428);
      }
    }
  }
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  bVar2 = Option::get_trigger_on_parse(pOVar15);
  if ((bVar2) &&
     (pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408), pOVar15->current_option_state_ == callback_run)) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    Option::clear(pOVar15);
  }
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  max_num = Option::get_type_size_min(pOVar15);
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  tmax = Option::get_items_expected_min(pOVar15);
  piVar17 = std::min<int>(&max_num,&tmax);
  local_42c = *piVar17;
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  collected = Option::get_items_expected_max(pOVar15);
  if (0x1ffffff < collected) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    bVar2 = Option::get_allow_extra_args(pOVar15);
    if (!bVar2) {
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      result_count = Option::get_type_size_max(pOVar15);
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      iVar6 = Option::get_expected_min(pOVar15);
      tVar3 = detail::checked_multiply<int>(&result_count,iVar6);
      if (tVar3) {
        local_804 = result_count;
      }
      else {
        local_804 = 0x20000000;
      }
      collected = local_804;
    }
  }
  local_440 = 0;
  res.field_2._12_4_ = 0;
  if (collected == 0) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    ::std::__cxx11::string::string((string *)&local_488,(string *)(rest.field_2._M_local_buf + 8));
    Option::get_flag_value
              ((string *)local_468,pOVar15,(string *)((long)&value.field_2 + 8),&local_488);
    ::std::__cxx11::string::~string((string *)&local_488);
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    ::std::__cxx11::string::string((string *)&local_4a8,(string *)local_468);
    Option::add_result(pOVar15,&local_4a8);
    ::std::__cxx11::string::~string((string *)&local_4a8);
    local_4b0 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_408);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,&local_4b0);
    ::std::__cxx11::string::~string((string *)local_468);
  }
  else {
    uVar20 = ::std::__cxx11::string::empty();
    if ((uVar20 & 1) == 0) {
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      ::std::__cxx11::string::string((string *)&local_4d0,(string *)(rest.field_2._M_local_buf + 8))
      ;
      Option::add_result(pOVar15,&local_4d0,(int *)(res.field_2._M_local_buf + 0xc));
      ::std::__cxx11::string::~string((string *)&local_4d0);
      local_4d8 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_408);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,&local_4d8);
      local_440 = res.field_2._12_4_;
    }
    else {
      uVar20 = ::std::__cxx11::string::empty();
      if ((uVar20 & 1) == 0) {
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        ::std::__cxx11::string::string((string *)&local_4f8,(string *)local_a8);
        Option::add_result(pOVar15,&local_4f8,(int *)(res.field_2._M_local_buf + 0xc));
        ::std::__cxx11::string::~string((string *)&local_4f8);
        current_.field_2._8_8_ =
             std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_408);
        std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                  (&this->parse_order_,(value_type *)((long)&current_.field_2 + 8));
        ::std::__cxx11::string::operator=((string *)local_a8,"");
        local_440 = res.field_2._12_4_;
      }
    }
  }
  while( true ) {
    local_841 = 0;
    if (local_440 < local_42c) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(args);
      local_841 = bVar2 ^ 0xff;
    }
    if ((local_841 & 1) == 0) break;
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(args);
    ::std::__cxx11::string::string(local_520,(string *)pvVar8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back(args);
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    ::std::__cxx11::string::string((string *)&local_540,local_520);
    Option::add_result(pOVar15,&local_540,(int *)(res.field_2._M_local_buf + 0xc));
    ::std::__cxx11::string::~string((string *)&local_540);
    local_548 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_408);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,&local_548);
    local_440 = res.field_2._12_4_ + local_440;
    ::std::__cxx11::string::~string(local_520);
  }
  if (local_440 < local_42c) {
    pAVar18 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    Option::get_name_abi_cxx11_(&local_568,pOVar15,false,false);
    iVar6 = local_42c;
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    Option::get_type_name_abi_cxx11_(&local_588,pOVar15);
    ArgumentMismatch::TypedAtLeast(pAVar18,&local_568,iVar6,&local_588);
    __cxa_throw(pAVar18,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
  }
  if (local_440 < collected) {
LAB_001896df:
    arg.field_2._8_8_ = _count_remaining_positionals(this,true);
    do {
      if (local_440 < collected) {
LAB_00189746:
        bVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(args);
        bVar2 = false;
        if (!bVar4) {
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back(args);
          CVar5 = _recognize(this,pvVar8,false);
          bVar2 = CVar5 == NONE;
        }
      }
      else {
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        bVar4 = Option::get_allow_extra_args(pOVar15);
        bVar2 = false;
        if (bVar4) goto LAB_00189746;
      }
      uVar1 = arg.field_2._8_8_;
      if ((!bVar2) ||
         (sVar19 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(args), sVar19 <= (ulong)uVar1)) goto LAB_0018997a;
      if ((this->validate_optional_arguments_ & 1U) != 0) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(args);
        ::std::__cxx11::string::string((string *)local_5b8,(string *)pvVar8);
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        Option::_validate(&local_5d8,pOVar15,(string *)local_5b8,0);
        ::std::__cxx11::string::operator=((string *)local_5b8,(string *)&local_5d8);
        ::std::__cxx11::string::~string((string *)&local_5d8);
        uVar20 = ::std::__cxx11::string::empty();
        if ((uVar20 & 1) == 0) {
          narg_name.field_2._12_4_ = 10;
        }
        else {
          narg_name.field_2._12_4_ = 0;
        }
        ::std::__cxx11::string::~string((string *)local_5b8);
        if (narg_name.field_2._12_4_ != 0) goto LAB_0018997a;
      }
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(args);
      ::std::__cxx11::string::string((string *)&local_5f8,(string *)pvVar8);
      Option::add_result(pOVar15,&local_5f8,(int *)(res.field_2._M_local_buf + 0xc));
      ::std::__cxx11::string::~string((string *)&local_5f8);
      res_1.field_2._8_8_ =
           std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_408);
      std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
                (&this->parse_order_,(value_type *)((long)&res_1.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
      local_440 = res.field_2._12_4_ + local_440;
    } while( true );
  }
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  bVar2 = Option::get_allow_extra_args(pOVar15);
  if (bVar2) goto LAB_001896df;
LAB_00189b33:
  if (0 < local_42c) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    iVar6 = Option::get_type_size_max(pOVar15);
    if (local_440 % iVar6 != 0) {
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      iVar6 = Option::get_type_size_max(pOVar15);
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      iVar7 = Option::get_type_size_min(pOVar15);
      if (iVar6 == iVar7) {
        local_6c9 = 1;
        pAVar18 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        Option::get_name_abi_cxx11_(&local_6a8,pOVar15,false,false);
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        iVar6 = Option::get_type_size_min(pOVar15);
        pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                            (local_408);
        Option::get_type_name_abi_cxx11_(&local_6c8,pOVar15);
        ArgumentMismatch::PartialType(pAVar18,&local_6a8,iVar6,&local_6c8);
        local_6c9 = 0;
        __cxa_throw(pAVar18,&ArgumentMismatch::typeinfo,ArgumentMismatch::~ArgumentMismatch);
      }
      pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                          (local_408);
      ::std::__cxx11::string::string((string *)&local_688);
      Option::add_result(pOVar15,&local_688);
      ::std::__cxx11::string::~string((string *)&local_688);
    }
  }
  pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408);
  bVar2 = Option::get_trigger_on_parse(pOVar15);
  if (bVar2) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    Option::run_callback(pOVar15);
  }
  uVar20 = ::std::__cxx11::string::empty();
  if ((uVar20 & 1) == 0) {
    ::std::operator+(&local_6f0,"-",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    ::std::__cxx11::string::operator=((string *)local_a8,(string *)&local_6f0);
    ::std::__cxx11::string::~string((string *)&local_6f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,(value_type *)local_a8);
  }
  this_local._7_1_ = 1;
LAB_00189e1c:
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::~string((string *)(rest.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  ::std::__cxx11::string::~string((string *)(arg_name.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
LAB_0018997a:
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (!bVar2) {
    pvVar8 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(args);
    CVar5 = _recognize(this,pvVar8,true);
    if (CVar5 == POSITIONAL_MARK) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::pop_back(args);
    }
  }
  if (((local_42c == 0) && (0 < collected)) && (local_440 == 0)) {
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    ::std::__cxx11::string::string((string *)&local_640);
    Option::get_flag_value
              ((string *)local_620,pOVar15,(string *)((long)&value.field_2 + 8),&local_640);
    ::std::__cxx11::string::~string((string *)&local_640);
    pOVar15 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_408)
    ;
    ::std::__cxx11::string::string((string *)&local_660,(string *)local_620);
    Option::add_result(pOVar15,&local_660);
    ::std::__cxx11::string::~string((string *)&local_660);
    local_668 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::get(local_408);
    std::vector<CLI::Option_*,_std::allocator<CLI::Option_*>_>::push_back
              (&this->parse_order_,&local_668);
    ::std::__cxx11::string::~string((string *)local_620);
  }
  goto LAB_00189b33;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos && dotloc < arg_name.size() - 1) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                std::string dummy1, dummy2;
                bool val = false;
                if((current_type == detail::Classifier::SHORT && detail::valid_first_char(args.back()[1])) ||
                   detail::split_long(args.back(), dummy1, dummy2)) {
                    val = sub->_parse_arg(args, current_type, true);
                }

                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}